

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

void print_http_error(Curl_easy *data)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  
  pcVar2 = Curl_dyn_ptr(&(data->state).headerb);
  iVar1 = strncmp(pcVar2,"HTTP",4);
  if (iVar1 == 0) {
    pcVar2 = strchr(pcVar2,0x20);
    if ((pcVar2 != (char *)0x0) && (pcVar2[1] != '\0')) {
      pcVar2 = pcVar2 + 1;
      pcVar3 = strchr(pcVar2,0xd);
      if (pcVar3 == (char *)0x0) {
        pcVar3 = strchr(pcVar2,10);
        cVar4 = '\n';
      }
      else {
        cVar4 = '\r';
      }
      if (pcVar3 != (char *)0x0) {
        *pcVar3 = '\0';
        Curl_failf(data,"The requested URL returned error: %s",pcVar2);
        *pcVar3 = cVar4;
        return;
      }
    }
  }
  Curl_failf(data,"The requested URL returned error: %d",(ulong)(uint)(data->req).httpcode);
  return;
}

Assistant:

static void print_http_error(struct Curl_easy *data)
{
  struct SingleRequest *k = &data->req;
  char *beg = Curl_dyn_ptr(&data->state.headerb);

  /* make sure that data->req.p points to the HTTP status line */
  if(!strncmp(beg, "HTTP", 4)) {

    /* skip to HTTP status code */
    beg = strchr(beg, ' ');
    if(beg && *++beg) {

      /* find trailing CR */
      char end_char = '\r';
      char *end = strchr(beg, end_char);
      if(!end) {
        /* try to find LF (workaround for non-compliant HTTP servers) */
        end_char = '\n';
        end = strchr(beg, end_char);
      }

      if(end) {
        /* temporarily replace CR or LF by NUL and print the error message */
        *end = '\0';
        failf(data, "The requested URL returned error: %s", beg);

        /* restore the previously replaced CR or LF */
        *end = end_char;
        return;
      }
    }
  }

  /* fall-back to printing the HTTP status code only */
  failf(data, "The requested URL returned error: %d", k->httpcode);
}